

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sat.cpp
# Opt level: O1

void __thiscall SAT::simplifyDB(SAT *this)

{
  Clause **ppCVar1;
  Clause *c;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  if ((this->learnts).sz == 0) {
    uVar3 = 0;
  }
  else {
    uVar6 = 0;
    uVar4 = 0;
    do {
      bVar2 = simplify(this,(this->learnts).data[uVar6]);
      ppCVar1 = (this->learnts).data;
      c = ppCVar1[uVar6];
      if (bVar2) {
        removeClause(this,c);
        uVar5 = uVar4;
      }
      else {
        uVar5 = (ulong)((int)uVar4 + 1);
        ppCVar1[uVar4] = c;
      }
      uVar3 = (uint)uVar5;
      uVar6 = uVar6 + 1;
      uVar4 = uVar5;
    } while (uVar6 < (this->learnts).sz);
  }
  (this->learnts).sz = uVar3;
  this->next_simp_db = this->clauses_literals + this->propagations + this->learnts_literals;
  return;
}

Assistant:

void SAT::simplifyDB() {
	unsigned int i;
	unsigned int j;
	for (i = j = 0; i < learnts.size(); i++) {
		if (simplify(*learnts[i])) {
			removeClause(*learnts[i]);
		} else {
			learnts[j++] = learnts[i];
		}
	}
	learnts.resize(j);
	next_simp_db = propagations + clauses_literals + learnts_literals;
}